

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_test.cc
# Opt level: O2

void __thiscall cpsm::testing::Matches::assert_matched(Matches *this,string_ref item)

{
  bool bVar1;
  TestAssertionFailure *this_00;
  
  bVar1 = matched(this,item);
  if (bVar1) {
    return;
  }
  this_00 = (TestAssertionFailure *)__cxa_allocate_exception(0x28);
  TestAssertionFailure::
  TestAssertionFailure<char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*>
            (this_00,"incorrectly failed to match \'",item,"\'");
  __cxa_throw(this_00,&TestAssertionFailure::typeinfo,TestAssertionFailure::~TestAssertionFailure);
}

Assistant:

void assert_matched(boost::string_ref const item) const {
    if (!matched(item)) {
      throw TestAssertionFailure("incorrectly failed to match '", item, "'");
    }
  }